

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  string message;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  if (this->MessageNever == false) {
    if (copy) {
      local_50.View_._M_str = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_0036955a;
      local_50.View_._M_str = "Up-to-date: ";
    }
    local_50.View_._M_len = 0xc;
    local_80.View_._M_str = (toFile->_M_dataplus)._M_p;
    local_80.View_._M_len = toFile->_M_string_length;
    cmStrCat<>(&local_a0,&local_50,&local_80);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,&local_a0,-1.0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
LAB_0036955a:
  if (type != TypeDir) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message =
      cmStrCat((copy ? "Installing: " : "Up-to-date: "), toFile);
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}